

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Mat LongDynXdot(double t,Mat *x,Mat *u)

{
  double *extraout_RDX;
  Mat MVar1;
  Mat local_30;
  Mat local_20;
  
  operator*(&local_20,&A_long);
  operator*(&local_30,&B_long);
  operator+(x,&local_20);
  Mat::~Mat(&local_30);
  Mat::~Mat(&local_20);
  MVar1.v_ = extraout_RDX;
  MVar1._0_8_ = x;
  return MVar1;
}

Assistant:

Mat LongDynXdot(const double t, Mat x, Mat u)
{	
    Mat xdot = A_long * x + B_long * u;
    return xdot;	
}